

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

void check_output(void *input_buffer,void *output_buffer,long frame_count)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  undefined1 in_stack_ffffffffffffff5f;
  String *in_stack_ffffffffffffff60;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff68;
  AssertHelper in_stack_ffffffffffffff70;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff78;
  AssertionResult local_80;
  AssertHelper local_70;
  Message local_68;
  undefined4 local_5c;
  AssertionResult local_58;
  uint local_44;
  AssertHelper local_40;
  Message local_38;
  undefined8 local_30;
  AssertionResult local_28 [2];
  
  local_30 = 0;
  testing::internal::EqHelper<false>::Compare<void_const*,decltype(nullptr)>
            ((char *)in_stack_ffffffffffffff78.ptr_,(char *)in_stack_ffffffffffffff70.data_,
             (void **)in_stack_ffffffffffffff68.ptr_,&in_stack_ffffffffffffff60->c_str_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff70.data_);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10abdc);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,0x226,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::Message::~Message((Message *)0x10ac1d);
  }
  local_44 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ac3c);
  if (local_44 == 0) {
    local_5c = 0x100;
    testing::internal::EqHelper<false>::Compare<long,int>
              ((char *)in_stack_ffffffffffffff78.ptr_,(char *)in_stack_ffffffffffffff70.data_,
               (long *)in_stack_ffffffffffffff68.ptr_,(int *)in_stack_ffffffffffffff60);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff70.data_);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10ac9e);
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                 ,0x227,pcVar2);
      testing::internal::AssertHelper::operator=(&local_70,&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      testing::Message::~Message((Message *)0x10acdf);
    }
    local_44 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10acfb);
    if (local_44 == 0) {
      testing::AssertionResult::AssertionResult
                ((AssertionResult *)in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_80);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_ffffffffffffff70.data_);
        testing::internal::GetBoolAssertionFailureMessage
                  ((AssertionResult *)&stack0xffffffffffffff60,&local_80.success_,"!!output_buffer",
                   "false");
        pcVar2 = testing::internal::String::c_str((String *)&stack0xffffffffffffff60);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                   ,0x228,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff70,(Message *)&stack0xffffffffffffff78);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff70);
        testing::internal::String::~String(in_stack_ffffffffffffff60);
        testing::Message::~Message((Message *)0x10adc2);
      }
      local_44 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10adde);
    }
  }
  return;
}

Assistant:

void check_output(const void * input_buffer, void * output_buffer, long frame_count)
{
  ASSERT_EQ(input_buffer, nullptr);
  ASSERT_EQ(frame_count, 256);
  ASSERT_TRUE(!!output_buffer);
}